

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

int pm_to_cham(int mndx)

{
  if (mndx == 0x155) {
    return 1;
  }
  if (mndx != 0x148) {
    if (mndx == 0x117) {
      return 2;
    }
    return 0;
  }
  return 3;
}

Assistant:

int pm_to_cham(int mndx)
{
	int mcham;

	switch (mndx) {
	case PM_CHAMELEON:	mcham = CHAM_CHAMELEON; break;
	case PM_DOPPELGANGER:	mcham = CHAM_DOPPELGANGER; break;
	case PM_SANDESTIN:	mcham = CHAM_SANDESTIN; break;
	default: mcham = CHAM_ORDINARY; break;
	}
	return mcham;
}